

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Lower.cpp
# Opt level: O2

void __thiscall Lowerer::GenerateFastInlineRegExpExec(Lowerer *this,Instr *instr)

{
  LowererMD *this_00;
  undefined2 valueType;
  Opnd *dst;
  Instr *argoutInlineSpecialized;
  code *pcVar1;
  bool bVar2;
  uint sourceContextId;
  uint functionId;
  BailOutKind BVar3;
  undefined4 *puVar4;
  SymOpnd *pSVar5;
  StackSym *pSVar6;
  LabelInstr *labelHelper;
  Opnd *pOVar7;
  RegOpnd *pRVar8;
  Lowerer *pLVar9;
  IndirOpnd *pIVar10;
  LabelInstr *target;
  RegOpnd *pRVar11;
  RegOpnd *pRVar12;
  Lowerer *this_01;
  LabelInstr *target_00;
  IntConstOpnd *pIVar13;
  LabelInstr *target_01;
  LabelInstr *target_02;
  HelperCallOpnd *src1Opnd;
  Instr *pIVar14;
  AddrOpnd *src;
  BailOutInfo *bailoutInfo;
  JnHelperMethod helperMethod;
  Opnd *local_88;
  Opnd *argsOpnd [2];
  AutoReuseOpnd autoReuseStackAllocationOpnd;
  RegOpnd *local_38;
  
  if (instr->m_opcode != CallDirect) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar4 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Lower.cpp"
                       ,0x50a8,"(instr->m_opcode == Js::OpCode::CallDirect)",
                       "instr->m_opcode == Js::OpCode::CallDirect");
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    *puVar4 = 0;
  }
  dst = instr->m_dst;
  pSVar5 = IR::Opnd::AsSymOpnd(instr->m_src2);
  pSVar6 = Sym::AsStackSym(pSVar5->m_sym);
  argoutInlineSpecialized = (pSVar6->field_5).m_instrDef;
  bVar2 = IR::Instr::FetchOperands(instr,&local_88,2);
  if (bVar2) {
    argsOpnd[1] = (Opnd *)CONCAT62(argsOpnd[1]._2_6_,(argsOpnd[0]->m_valueType).field_0.bits);
    bVar2 = ValueType::IsLikelyString((ValueType *)(argsOpnd + 1));
    if (bVar2) {
      bVar2 = IR::Opnd::IsTaggedInt(local_88);
      if (!bVar2) {
        labelHelper = IR::LabelInstr::New(Label,this->m_func,true);
        pLVar9 = (Lowerer *)(argsOpnd + 1);
        argsOpnd[1] = (Opnd *)CONCAT62(argsOpnd[1]._2_6_,(argsOpnd[0]->m_valueType).field_0.bits);
        bVar2 = ValueType::IsString((ValueType *)pLVar9);
        if (bVar2) {
          local_38 = (RegOpnd *)argsOpnd[0];
        }
        else {
          local_38 = GetRegOpnd(pLVar9,argsOpnd[0],instr,this->m_func,TyVar);
          pRVar8 = IR::Opnd::AsRegOpnd(&local_38->super_Opnd);
          GenerateStringTest(this,pRVar8,instr,labelHelper,(LabelInstr *)0x0,true);
        }
        bVar2 = IR::Opnd::IsNotTaggedValue(local_88);
        if (!bVar2) {
          LowererMD::GenerateObjectTest(&this->m_lowererMD,local_88,instr,labelHelper,false);
        }
        pLVar9 = this;
        pOVar7 = LoadVTableValueOpnd(this,instr,VtableJavascriptRegExp);
        pRVar8 = GetRegOpnd(pLVar9,local_88,instr,this->m_func,TyVar);
        pLVar9 = (Lowerer *)IR::Opnd::AsRegOpnd(&pRVar8->super_Opnd);
        pIVar10 = IR::IndirOpnd::New((RegOpnd *)pLVar9,0,TyUint64,instr->m_func,false);
        InsertCompareBranch(pLVar9,&pIVar10->super_Opnd,pOVar7,BrNeq_A,labelHelper,instr,false);
        target = IR::LabelInstr::New(Label,this->m_func,false);
        sourceContextId = Func::GetSourceContextId(this->m_func);
        functionId = Func::GetLocalFunctionId(this->m_func);
        bVar2 = Js::Phases::IsEnabled
                          ((Phases *)&DAT_01441eb0,ExecBOIFastPathPhase,sourceContextId,functionId);
        if (!bVar2) {
          pRVar11 = IR::RegOpnd::New(TyUint64,this->m_func);
          pRVar12 = IR::Opnd::AsRegOpnd(&pRVar8->super_Opnd);
          pIVar10 = IR::IndirOpnd::New(pRVar12,0x20,TyUint64,this->m_func,false);
          InsertMove(&pRVar11->super_Opnd,&pIVar10->super_Opnd,instr,true);
          this_01 = (Lowerer *)IR::RegOpnd::New(TyUint64,this->m_func);
          pIVar10 = IR::IndirOpnd::New(pRVar11,0x20,TyUint64,this->m_func,false);
          InsertMove((Opnd *)this_01,&pIVar10->super_Opnd,instr,true);
          target_00 = IR::LabelInstr::New(Label,this->m_func,false);
          pIVar10 = IR::IndirOpnd::New((RegOpnd *)this_01,0x15,TyUint8,this->m_func,false);
          pLVar9 = (Lowerer *)0x7;
          pIVar13 = IR::IntConstOpnd::New(7,TyUint8,this->m_func,false);
          InsertCompareBranch(pLVar9,&pIVar10->super_Opnd,&pIVar13->super_Opnd,BrNeq_A,target_00,
                              instr,false);
          pIVar10 = IR::IndirOpnd::New((RegOpnd *)this_01,0x14,TyUint8,this->m_func,false);
          pIVar13 = IR::IntConstOpnd::New(2,TyUint8,this->m_func,false);
          InsertTestBranch(&pIVar10->super_Opnd,&pIVar13->super_Opnd,BrNeq_A,target_00,instr);
          target_01 = IR::LabelInstr::New(Label,this->m_func,false);
          pRVar11 = IR::Opnd::AsRegOpnd(&local_38->super_Opnd);
          pIVar10 = IR::IndirOpnd::New(pRVar11,0x18,TyUint32,this->m_func,false);
          pLVar9 = (Lowerer *)0x2;
          pIVar13 = IR::IntConstOpnd::New(2,TyUint32,this->m_func,false);
          InsertCompareBranch(pLVar9,&pIVar10->super_Opnd,&pIVar13->super_Opnd,BrLt_A,target_01,
                              instr,false);
          pRVar11 = IR::RegOpnd::New(TyInt64,this->m_func);
          pRVar12 = IR::Opnd::AsRegOpnd(&local_38->super_Opnd);
          pIVar10 = IR::IndirOpnd::New(pRVar12,0x10,TyUint64,this->m_func,false);
          InsertMove(&pRVar11->super_Opnd,&pIVar10->super_Opnd,instr,true);
          target_02 = IR::LabelInstr::New(Label,this->m_func,false);
          InsertTestBranch(&pRVar11->super_Opnd,&pRVar11->super_Opnd,BrNeq_A,target_02,instr);
          LowererMD::LoadHelperArgument(&this->m_lowererMD,instr,&local_38->super_Opnd);
          src1Opnd = IR::HelperCallOpnd::New(HelperString_GetSz,this->m_func);
          pIVar14 = IR::Instr::New(Call,&pRVar11->super_Opnd,&src1Opnd->super_Opnd,this->m_func);
          IR::Instr::InsertBefore(instr,pIVar14);
          LowererMD::LowerCall(&this->m_lowererMD,pIVar14,0);
          IR::Instr::InsertBefore(instr,&target_02->super_Instr);
          pRVar12 = IR::RegOpnd::New(TyUint32,this->m_func);
          pIVar10 = IR::IndirOpnd::New(pRVar11,0,TyUint32,this->m_func,false);
          InsertMove(&pRVar12->super_Opnd,&pIVar10->super_Opnd,instr,true);
          pIVar10 = IR::IndirOpnd::New((RegOpnd *)this_01,0x18,TyUint32,this->m_func,false);
          InsertCompareBranch(this_01,&pIVar10->super_Opnd,&pRVar12->super_Opnd,BrEq_A,target_00,
                              instr,false);
          IR::Instr::InsertBefore(instr,&target_01->super_Instr);
          pRVar11 = IR::Opnd::AsRegOpnd(&pRVar8->super_Opnd);
          pIVar10 = IR::IndirOpnd::New(pRVar11,0x30,TyVar,this->m_func,false);
          src = IR::AddrOpnd::NewNull(this->m_func);
          InsertMove(&pIVar10->super_Opnd,&src->super_Opnd,instr,true);
          pRVar11 = IR::Opnd::AsRegOpnd(&pRVar8->super_Opnd);
          pIVar10 = IR::IndirOpnd::New(pRVar11,0x38,TyUint32,this->m_func,false);
          pIVar13 = IR::IntConstOpnd::New(0,TyUint32,this->m_func,false);
          InsertMove(&pIVar10->super_Opnd,&pIVar13->super_Opnd,instr,true);
          if (dst != (Opnd *)0x0) {
            pOVar7 = LoadLibraryValueOpnd(this,instr,ValueNull);
            InsertMove(dst,pOVar7,instr,true);
          }
          InsertBranch(Br,target,instr);
          IR::Instr::InsertBefore(instr,&target_00->super_Instr);
        }
        pIVar14 = IR::Instr::New(CALL,instr->m_func);
        if (dst != (Opnd *)0x0) {
          IR::Instr::SetDst(pIVar14,dst);
        }
        IR::Instr::InsertBefore(instr,pIVar14);
        if ((instr->field_0x38 & 0x10) != 0) {
          BVar3 = IR::Instr::GetBailOutKind(instr);
          if ((BVar3 & ~(BailOutKindBits|BailOutIntOnly)) == BailOutOnImplicitCalls) {
            bailoutInfo = IR::Instr::GetBailOutInfo(instr);
            BVar3 = IR::Instr::GetBailOutKind(instr);
            pIVar14 = AddBailoutToHelperCallInstr(this,pIVar14,bailoutInfo,BVar3,instr);
          }
        }
        this_00 = &this->m_lowererMD;
        LowererMD::LoadHelperArgument(this_00,pIVar14,&local_38->super_Opnd);
        LowererMD::LoadHelperArgument(this_00,pIVar14,&pRVar8->super_Opnd);
        LoadScriptContext(this,pIVar14);
        argsOpnd[1] = (Opnd *)0x0;
        if (dst == (Opnd *)0x0) {
          helperMethod = HelperRegExp_ExecResultNotUsed;
        }
        else {
          helperMethod = HelperRegExp_ExecResultUsed;
          if ((instr->field_0x36 & 8) != 0) {
            pRVar8 = IR::RegOpnd::New(TyVar,this->m_func);
            IR::AutoReuseOpnd::Initialize
                      ((AutoReuseOpnd *)(argsOpnd + 1),&pRVar8->super_Opnd,this->m_func,true);
            valueType = dst->m_valueType;
            IR::Opnd::SetValueType(&pRVar8->super_Opnd,(ValueType)valueType);
            GenerateMarkTempAlloc(this,pRVar8,Js::JavascriptArray::StackAllocationSize,pIVar14);
            helperMethod = HelperRegExp_ExecResultUsedAndMayBeTemp;
            LowererMD::LoadHelperArgument(this_00,pIVar14,&pRVar8->super_Opnd);
          }
        }
        LowererMD::ChangeToHelperCall
                  (this_00,pIVar14,helperMethod,(LabelInstr *)0x0,(Opnd *)0x0,(PropertySymOpnd *)0x0
                   ,false);
        IR::Instr::InsertAfter(instr,&target->super_Instr);
        IR::Instr::InsertBefore(instr,&labelHelper->super_Instr);
        pLVar9 = (Lowerer *)0x9;
        InsertBranch(Br,true,target,&labelHelper->super_Instr);
        RelocateCallDirectToHelperPath(pLVar9,argoutInlineSpecialized,labelHelper);
        IR::AutoReuseOpnd::~AutoReuseOpnd((AutoReuseOpnd *)(argsOpnd + 1));
      }
    }
  }
  return;
}

Assistant:

void
Lowerer::GenerateFastInlineRegExpExec(IR::Instr * instr)
{
    // a.exec(b)
    // We want to emit the fast path when 'a' is a regex and 'b' is a string

    Assert(instr->m_opcode == Js::OpCode::CallDirect);
    IR::Opnd * callDst = instr->GetDst();

    //ArgOut_A_InlineSpecialized
    IR::Instr * tmpInstr = instr->GetSrc2()->AsSymOpnd()->m_sym->AsStackSym()->m_instrDef;

    IR::Opnd * argsOpnd[2];
    if (!instr->FetchOperands(argsOpnd, 2))
    {
        return;
    }

    IR::Opnd *opndString = argsOpnd[1];
    if(!opndString->GetValueType().IsLikelyString() || argsOpnd[0]->IsTaggedInt())
    {
        return;
    }

    IR::LabelInstr *labelHelper = IR::LabelInstr::New(Js::OpCode::Label, this->m_func, true);
    if(!opndString->GetValueType().IsString())
    {
        opndString = GetRegOpnd(opndString, instr, m_func, TyVar);
        this->GenerateStringTest(opndString->AsRegOpnd(), instr, labelHelper);
    }

    IR::Opnd *opndRegex = argsOpnd[0];
    if(!opndRegex->IsNotTaggedValue())
    {
        m_lowererMD.GenerateObjectTest(opndRegex, instr, labelHelper);
    }

    IR::Opnd * vtableOpnd = LoadVTableValueOpnd(instr, VTableValue::VtableJavascriptRegExp);

    // cmp  [regex], vtableAddress
    // jne  $labelHelper
    opndRegex = GetRegOpnd(opndRegex, instr, m_func, TyVar);
    InsertCompareBranch(
        IR::IndirOpnd::New(opndRegex->AsRegOpnd(), 0, TyMachPtr, instr->m_func),
        vtableOpnd,
        Js::OpCode::BrNeq_A,
        labelHelper,
        instr);

    IR::LabelInstr *doneLabel = IR::LabelInstr::New(Js::OpCode::Label, m_func);

    if (!PHASE_OFF(Js::ExecBOIFastPathPhase, m_func))
    {
        // Load pattern from regex operand
        IR::RegOpnd *opndPattern = IR::RegOpnd::New(TyMachPtr, m_func);
        Lowerer::InsertMove(
            opndPattern,
            IR::IndirOpnd::New(opndRegex->AsRegOpnd(), Js::JavascriptRegExp::GetOffsetOfPattern(), TyMachPtr, m_func),
            instr);

        // Load program from pattern
        IR::RegOpnd *opndProgram = IR::RegOpnd::New(TyMachPtr, m_func);
        Lowerer::InsertMove(
            opndProgram,
            IR::IndirOpnd::New(opndPattern, offsetof(UnifiedRegex::RegexPattern, rep) + offsetof(UnifiedRegex::RegexPattern::UnifiedRep, program), TyMachPtr, m_func),
            instr);

        IR::LabelInstr *labelFastHelper = IR::LabelInstr::New(Js::OpCode::Label, m_func);

        // We want the program's tag to be BOILiteral2Tag
        InsertCompareBranch(
            IR::IndirOpnd::New(opndProgram, (int32)UnifiedRegex::Program::GetOffsetOfTag(), TyUint8, m_func),
            IR::IntConstOpnd::New((IntConstType)UnifiedRegex::Program::GetBOILiteral2Tag(), TyUint8, m_func),
            Js::OpCode::BrNeq_A,
            labelFastHelper,
            instr);

        // Test the program's flags for "global"
        InsertTestBranch(
            IR::IndirOpnd::New(opndProgram, offsetof(UnifiedRegex::Program, flags), TyUint8, m_func),
            IR::IntConstOpnd::New(UnifiedRegex::GlobalRegexFlag, TyUint8, m_func),
            Js::OpCode::BrNeq_A,
            labelFastHelper,
            instr);

        IR::LabelInstr *labelNoMatch = IR::LabelInstr::New(Js::OpCode::Label, m_func);

        // If string length < 2...
        InsertCompareBranch(
            IR::IndirOpnd::New(opndString->AsRegOpnd(), offsetof(Js::JavascriptString, m_charLength), TyUint32, m_func),
            IR::IntConstOpnd::New(2, TyUint32, m_func),
            Js::OpCode::BrLt_A,
            labelNoMatch,
            instr);

        // ...or the DWORD doesn't match the pattern...
        IR::RegOpnd *opndBuffer = IR::RegOpnd::New(TyMachReg, m_func);
        Lowerer::InsertMove(
            opndBuffer,
            IR::IndirOpnd::New(opndString->AsRegOpnd(), offsetof(Js::JavascriptString, m_pszValue), TyMachPtr, m_func),
            instr);

        IR::LabelInstr *labelGotString = IR::LabelInstr::New(Js::OpCode::Label, m_func);

        InsertTestBranch(opndBuffer, opndBuffer, Js::OpCode::BrNeq_A, labelGotString, instr);

        m_lowererMD.LoadHelperArgument(instr, opndString);
        IR::Instr *instrCall = IR::Instr::New(Js::OpCode::Call, opndBuffer, IR::HelperCallOpnd::New(IR::HelperString_GetSz, m_func), m_func);
        instr->InsertBefore(instrCall);
        m_lowererMD.LowerCall(instrCall, 0);

        instr->InsertBefore(labelGotString);

        IR::RegOpnd *opndBufferDWORD = IR::RegOpnd::New(TyUint32, m_func);
        Lowerer::InsertMove(
            opndBufferDWORD,
            IR::IndirOpnd::New(opndBuffer, 0, TyUint32, m_func),
            instr);

        InsertCompareBranch(
            IR::IndirOpnd::New(opndProgram, (int32)(UnifiedRegex::Program::GetOffsetOfRep() + UnifiedRegex::Program::GetOffsetOfBOILiteral2Literal()), TyUint32, m_func),
            opndBufferDWORD,
            Js::OpCode::BrEq_A,
            labelFastHelper,
            instr);

        // ...then set the last index to 0...
        instr->InsertBefore(labelNoMatch);

        Lowerer::InsertMove(
            IR::IndirOpnd::New(opndRegex->AsRegOpnd(), Js::JavascriptRegExp::GetOffsetOfLastIndexVar(), TyVar, m_func),
            IR::AddrOpnd::NewNull(m_func),
            instr);

        Lowerer::InsertMove(
            IR::IndirOpnd::New(opndRegex->AsRegOpnd(), Js::JavascriptRegExp::GetOffsetOfLastIndexOrFlag(), TyUint32, m_func),
            IR::IntConstOpnd::New(0, TyUint32, m_func),
            instr);

        // ...and set the dst to null...
        if (callDst)
        {
            Lowerer::InsertMove(
                callDst,
                LoadLibraryValueOpnd(instr, LibraryValue::ValueNull),
                instr);
        }

        // ...and we're done.
        this->InsertBranch(Js::OpCode::Br, doneLabel, instr);

        instr->InsertBefore(labelFastHelper);
    }

    IR::Instr * helperCallInstr = IR::Instr::New(LowererMD::MDCallOpcode, instr->m_func);
    if (callDst)
    {
        helperCallInstr->SetDst(callDst);
    }
    instr->InsertBefore(helperCallInstr);
    if (instr->HasBailOutInfo() && BailOutInfo::IsBailOutOnImplicitCalls(instr->GetBailOutKind()))
    {
        helperCallInstr = AddBailoutToHelperCallInstr(helperCallInstr, instr->GetBailOutInfo(), instr->GetBailOutKind(), instr);
    }
    // [stackAllocationPointer, ]scriptcontext, regexp, string (to be pushed in reverse order)

    //string, regexp
    this->m_lowererMD.LoadHelperArgument(helperCallInstr, opndString);
    this->m_lowererMD.LoadHelperArgument(helperCallInstr, opndRegex);

    // script context
    LoadScriptContext(helperCallInstr);

    IR::JnHelperMethod helperMethod;
    IR::AutoReuseOpnd autoReuseStackAllocationOpnd;
    if (callDst)
    {
        if (instr->dstIsTempObject)
        {
            helperMethod = IR::JnHelperMethod::HelperRegExp_ExecResultUsedAndMayBeTemp;

            // Allocate some space on the stack for the result array
            IR::RegOpnd *const stackAllocationOpnd = IR::RegOpnd::New(TyVar, m_func);
            autoReuseStackAllocationOpnd.Initialize(stackAllocationOpnd, m_func);
            stackAllocationOpnd->SetValueType(callDst->GetValueType());
            GenerateMarkTempAlloc(stackAllocationOpnd, Js::JavascriptArray::StackAllocationSize, helperCallInstr);
            m_lowererMD.LoadHelperArgument(helperCallInstr, stackAllocationOpnd);
        }
        else
        {
            helperMethod = IR::JnHelperMethod::HelperRegExp_ExecResultUsed;
        }
    }
    else
    {
        helperMethod = IR::JnHelperMethod::HelperRegExp_ExecResultNotUsed;
    }

    m_lowererMD.ChangeToHelperCall(helperCallInstr, helperMethod);

    instr->InsertAfter(doneLabel);
    instr->InsertBefore(labelHelper);
    InsertBranch(Js::OpCode::Br, true, doneLabel, labelHelper);

    RelocateCallDirectToHelperPath(tmpInstr, labelHelper);
}